

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O2

int netaddr_create_host_bin(netaddr *host,netaddr *netmask,void *number,size_t num_length)

{
  byte *pbVar1;
  byte bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined8 uVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  
  uVar5 = *(undefined8 *)(netmask->_addr + 8);
  *(undefined8 *)host->_addr = *(undefined8 *)netmask->_addr;
  *(undefined8 *)(host->_addr + 8) = uVar5;
  uVar3 = netmask->_type;
  uVar4 = netmask->_prefix_len;
  host->_type = uVar3;
  host->_prefix_len = uVar4;
  bVar6 = netaddr_get_af_maxprefix((uint)(byte)uVar3);
  host->_prefix_len = bVar6;
  if (bVar6 == 0) {
    iVar8 = -1;
  }
  else {
    iVar8 = 0;
    if ((num_length != 0) && (bVar2 = netmask->_prefix_len, bVar6 != bVar2)) {
      uVar9 = (ulong)(byte)((int)(short)(((ushort)bVar6 - (ushort)bVar2) + 7) / 8);
      lVar7 = num_length - uVar9;
      if (num_length < uVar9) {
        uVar9 = (bVar6 >> 3) - num_length;
        lVar7 = 0;
      }
      else {
        uVar9 = (ulong)(bVar2 >> 3);
        if ((bVar2 & 7) != 0) {
          bVar6 = (byte)(-0x100 >> (bVar2 & 7)) & host->_addr[uVar9];
          host->_addr[uVar9] = bVar6;
          pbVar1 = (byte *)((long)number + lVar7);
          lVar7 = lVar7 + 1;
          host->_addr[uVar9] = (byte)(0xff >> (bVar2 & 7)) & *pbVar1 | bVar6;
          uVar9 = uVar9 + 1;
        }
      }
      memcpy(host->_addr + uVar9,(void *)((long)number + lVar7),num_length - lVar7);
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int
netaddr_create_host_bin(struct netaddr *host, const struct netaddr *netmask, const void *number, size_t num_length) {
  size_t host_index, number_index;
  uint8_t host_part_length;
  const uint8_t *number_byte;
  uint8_t mask;

  number_byte = number;

  /* copy netmask with prefixlength max */
  memcpy(host, netmask, sizeof(*netmask));
  host->_prefix_len = netaddr_get_maxprefix(host);

  /* unknown address type */
  if (host->_prefix_len == 0) {
    return -1;
  }

  /* netmask has no host part */
  if (host->_prefix_len == netmask->_prefix_len || num_length == 0) {
    return 0;
  }

  /* calculate starting byte in host and number */
  host_part_length = (host->_prefix_len - netmask->_prefix_len + 7) / 8;
  if (host_part_length > num_length) {
    host_index = host->_prefix_len / 8 - num_length;
    number_index = 0;
  }
  else {
    host_index = netmask->_prefix_len / 8;
    number_index = num_length - host_part_length;

    /* copy bit masked part */
    if ((netmask->_prefix_len & 7) != 0) {
      mask = (255 >> (netmask->_prefix_len & 7));
      host->_addr[host_index] &= (~mask);
      host->_addr[host_index] |= (number_byte[number_index++]) & mask;
      host_index++;
    }
  }

  /* copy bytes */
  memcpy(&host->_addr[host_index], &number_byte[number_index], num_length - number_index);
  return 0;
}